

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

void __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::UnChain
          (StringBuilder<Memory::ArenaAllocator> *this,char16 *pBuf,charcount_t bufLen)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Data *local_40;
  Data *chunk;
  Data *pDStack_30;
  charcount_t srcLength;
  Data *next;
  char16 *pSrcBuf;
  charcount_t lastChunkCount;
  charcount_t bufLen_local;
  char16 *pBuf_local;
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  pSrcBuf._0_4_ = this->count;
  bVar2 = IsChained(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0xe0,"(this->IsChained())","this->IsChained()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (bufLen < this->count) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0xe2,"(bufLen >= this->count)","bufLen >= this->count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  next = this->firstChunk;
  pDStack_30 = this->secondChunk;
  chunk._4_4_ = this->firstChunkLength;
  local_40 = this->firstChunk;
  pSrcBuf._4_4_ = bufLen;
  _lastChunkCount = pBuf;
  while( true ) {
    if (local_40 == this->lastChunk) {
      if (pSrcBuf._4_4_ < (charcount_t)pSrcBuf) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      js_wmemcpy_s(_lastChunkCount,(ulong)pSrcBuf._4_4_,(char16 *)(this->lastChunk + 1),
                   (ulong)(charcount_t)pSrcBuf);
      return;
    }
    if (pSrcBuf._4_4_ < chunk._4_4_) break;
    js_wmemcpy_s(_lastChunkCount,(ulong)pSrcBuf._4_4_,(char16 *)next,(ulong)chunk._4_4_);
    pSrcBuf._4_4_ = pSrcBuf._4_4_ - chunk._4_4_;
    _lastChunkCount = _lastChunkCount + chunk._4_4_;
    pSrcBuf._0_4_ = (charcount_t)pSrcBuf - chunk._4_4_;
    local_40 = pDStack_30;
    next = pDStack_30 + 1;
    chunk._4_4_ = (pDStack_30->u).chained.length;
    pDStack_30 = (pDStack_30->u).chained.next;
  }
  Throw::FatalInternalError(-0x7fffbffb);
}

Assistant:

void UnChain(__out __ecount(bufLen) char16 *pBuf, charcount_t bufLen)
        {
            charcount_t lastChunkCount = this->count;

            Assert(this->IsChained());

            Assert(bufLen >= this->count);
            char16 *pSrcBuf = this->firstChunk->u.single.buffer;
            Data *next = this->secondChunk;
            charcount_t srcLength = this->firstChunkLength;

            for (Data *chunk = this->firstChunk; chunk != this->lastChunk; next = chunk->u.chained.next)
            {
                if (bufLen < srcLength)
                {
                    Throw::FatalInternalError();
                }
                js_wmemcpy_s(pBuf, bufLen, pSrcBuf, srcLength);
                bufLen -= srcLength;
                pBuf += srcLength;
                lastChunkCount -= srcLength;

                chunk = next;
                pSrcBuf = chunk->u.chained.buffer;
                srcLength = chunk->u.chained.length;
            }

            if (bufLen < lastChunkCount)
            {
                Throw::FatalInternalError();
            }
            js_wmemcpy_s(pBuf, bufLen, this->lastChunk->u.chained.buffer, lastChunkCount);
        }